

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

string * __thiscall
lscpp::stdio_transporter::read_line_abi_cxx11_
          (string *__return_storage_ptr__,stdio_transporter *this)

{
  char cVar1;
  pointer pcVar2;
  size_t local_28;
  size_t pos;
  char c;
  stdio_transporter *this_local;
  string *line;
  
  pos._7_1_ = read_char(this);
  local_28 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while (pos._7_1_ != '\r') {
    reserve(this,local_28);
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data_);
    pcVar2[local_28] = pos._7_1_;
    local_28 = local_28 + 1;
    pos._7_1_ = read_char(this);
  }
  cVar1 = read_char(this);
  if (cVar1 == '\n') {
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data_);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stdio_transporter::read_line() {
  char c = read_char();
  std::size_t pos = 0;
  std::string line;
#ifdef _WIN32
  while (c != char_lf) {
    reserve(pos);
    data_.get()[pos] = c;
    pos++;
    c = read_char();
  }
  line.append(data_.get(), pos);
#else
  while (c != char_cr) {
    reserve(pos);
    data_.get()[pos] = c;
    pos++;
    c = read_char();
  }
  c = read_char();
  if (c == char_lf) {
    line.append(data_.get(), pos);
  } else {
    // TODO error
  }
#endif
  return line;
}